

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O0

void touch_file(char *path)

{
  FILE *__stream;
  int local_1c;
  int i;
  FILE *fp;
  char *path_local;
  
  __stream = fopen64("testfile","w+");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-poll.c"
            ,0x3b,"(fp = fopen(FIXTURE, \"w+\"))");
    abort();
  }
  touch_file::count = touch_file::count + 1;
  local_1c = touch_file::count;
  while (local_1c != 0) {
    fputc(0x2a,__stream);
    local_1c = local_1c + -1;
  }
  fclose(__stream);
  return;
}

Assistant:

static void touch_file(const char* path) {
  static int count;
  FILE* fp;
  int i;

  ASSERT((fp = fopen(FIXTURE, "w+")));

  /* Need to change the file size because the poller may not pick up
   * sub-second mtime changes.
   */
  i = ++count;

  while (i--)
    fputc('*', fp);

  fclose(fp);
}